

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_make_uvector_op(sexp ctx,sexp self,sexp_sint_t n,sexp elt_type,sexp len)

{
  byte bVar1;
  sexp psVar2;
  char *msg;
  sexp_sint_t n_00;
  long lVar3;
  long lVar4;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  lVar3 = (long)elt_type >> 1;
  local_38 = (sexp)0x43e;
  if (lVar3 == 3) {
    psVar2 = sexp_make_bytes_op(ctx,(sexp)0x0,n,len,(sexp)&DAT_00000001);
    return psVar2;
  }
  psVar2 = elt_type;
  if ((((ulong)elt_type & 1) != 0) && (psVar2 = len, ((ulong)len & 1) != 0)) {
    if (lVar3 - 0x10U < 0xfffffffffffffff1) {
      msg = "unknown uniform vector type";
    }
    else {
      lVar4 = (long)len >> 1;
      if (-1 < lVar4) {
        local_30.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_30;
        local_38 = sexp_alloc_tagged_aux(ctx,0x20,0x26);
        if ((((ulong)local_38 & 3) != 0) || (local_38->tag != 0x13)) {
          bVar1 = ""[lVar3];
          (local_38->value).flonum_bits[8] = (char)lVar3;
          (local_38->value).uvector.length = lVar4;
          psVar2 = sexp_make_bytes_op(ctx,(sexp)0x0,n_00,(sexp)((ulong)bVar1 * lVar4 + 7 >> 2 | 1),
                                      (sexp)&DAT_00000001);
          (local_38->value).type.name = psVar2;
          if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x13)) {
            local_38 = psVar2;
          }
        }
        (ctx->value).context.saves = local_30.next;
        return local_38;
      }
      msg = "negative length";
      elt_type = len;
    }
    psVar2 = sexp_xtype_exception(ctx,self,msg,elt_type);
    return psVar2;
  }
  psVar2 = sexp_type_exception(ctx,self,2,psVar2);
  return psVar2;
}

Assistant:

sexp sexp_make_uvector_op(sexp ctx, sexp self, sexp_sint_t n, sexp elt_type, sexp len) {
  sexp_sint_t etype = sexp_unbox_fixnum(elt_type), elen = sexp_unbox_fixnum(len), clen;
  sexp_gc_var1(res);
  if (etype == SEXP_U8)
    return sexp_make_bytes(ctx, len, SEXP_ZERO);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, elt_type);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
  if (etype < SEXP_U1 || etype >= SEXP_END_OF_UNIFORM_TYPES)
    return sexp_xtype_exception(ctx, self, "unknown uniform vector type", elt_type);
  if (elen < 0)
    return sexp_xtype_exception(ctx, self, "negative length", len);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_type(ctx, uvector, SEXP_UNIFORM_VECTOR);
  if (!sexp_exceptionp(res)) {
    clen = ((elen * sexp_uvector_element_size(etype)) + 7) / 8;
    sexp_uvector_type(res) = etype;
    sexp_uvector_length(res) = elen;
    sexp_uvector_bytes(res) = sexp_make_bytes(ctx, sexp_make_fixnum(clen), SEXP_ZERO);
    if (sexp_exceptionp(sexp_uvector_bytes(res)))
      res = sexp_uvector_bytes(res);
  }
  sexp_gc_release1(ctx);
  return res;
}